

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::VerifyPageHeapPattern(LargeHeapBlock *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = IsAll((byte *)this->pageHeapData->objectPageAddr,(ulong)this->pageHeapData->paddingBytes,
                0xf0);
  if (bVar2) {
    bVar2 = IsAll((byte *)this->pageHeapData->objectEndAddr,(ulong)this->pageHeapData->unusedBytes,
                  0xf0);
    if (bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x14f,"(false)","false");
    if (bVar2) {
      *puVar3 = 0;
      ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,2);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x149,"(false)","false");
    if (bVar2) {
      *puVar3 = 0;
      ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,2);
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

_NOINLINE
void LargeHeapBlock::VerifyPageHeapPattern()
{
    if (!IsAll((byte*)pageHeapData->objectPageAddr, pageHeapData->paddingBytes, PageHeapMemFill))
    {
        Assert(false);
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 2);
    }

    if (!IsAll((byte*)pageHeapData->objectEndAddr, pageHeapData->unusedBytes, PageHeapMemFill))
    {
        Assert(false);
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 2);
    }
}